

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_double_&,_const_double_&> * __thiscall
Catch::ExprLhs<double_const&>::operator==
          (BinaryExpr<const_double_&,_const_double_&> *__return_storage_ptr__,
          ExprLhs<double_const&> *this,double *rhs)

{
  double *lhs;
  bool comparisonResult;
  StringRef local_30;
  double *local_20;
  double *rhs_local;
  ExprLhs<const_double_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (double *)this;
  this_local = (ExprLhs<const_double_&> *)__return_storage_ptr__;
  comparisonResult = compareEqual<double,double>(*(double **)this,rhs);
  lhs = *(double **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_double_&,_const_double_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }